

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall cmComputeLinkDepends::AddLinkObject(cmComputeLinkDepends *this,cmLinkItem *item)

{
  _Rb_tree_color _Var1;
  pointer pLVar2;
  string *psVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>,_bool> pVar4;
  int index;
  _Rb_tree_color local_94;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60;
  
  pVar4 = AllocateLinkEntry(this,item);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    _Var1 = pVar4.first._M_node._M_node[3]._M_color;
    pLVar2 = (this->EntryList).
             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_94 = _Var1;
    psVar3 = cmLinkItem::AsStr_abi_cxx11_(item);
    std::__cxx11::string::string((string *)&local_80,(string *)psVar3);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_90,
                   (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    *)&item->Backtrace);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_60,&local_80,(cmListFileBacktrace *)&local_90);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
              (&pLVar2[(int)_Var1].Item,&local_60);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
    std::__cxx11::string::~string((string *)&local_80);
    pLVar2[(int)_Var1].Kind = Object;
    std::vector<int,std::allocator<int>>::emplace_back<int&>
              ((vector<int,std::allocator<int>> *)&this->ObjectEntries,(int *)&local_94);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::AddLinkObject(cmLinkItem const& item)
{
  // Allocate a spot for the item entry.
  auto lei = this->AllocateLinkEntry(item);

  // Check if the item entry has already been added.
  if (!lei.second) {
    return;
  }

  // Initialize the item entry.
  int index = lei.first->second;
  LinkEntry& entry = this->EntryList[index];
  entry.Item = BT<std::string>(item.AsStr(), item.Backtrace);
  entry.Kind = LinkEntry::Object;

  // Record explicitly linked object files separately.
  this->ObjectEntries.emplace_back(index);
}